

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

Registry * tvm::runtime::Registry::Register(string *name,bool override)

{
  bool bVar1;
  Registry *pRVar2;
  mapped_type *ppRVar3;
  ostringstream *poVar4;
  ostream *poVar5;
  pointer ppVar6;
  LogMessageFatal local_1d8;
  Registry *local_40;
  Registry *r;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
  local_30;
  iterator it;
  Manager *m;
  bool override_local;
  string *name_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
             )Manager::Global();
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>_>
               *)it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
                 ._M_cur,name);
  r = (Registry *)
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>_>
      ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>_>
             *)it.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
               ._M_cur);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
                      *)&r);
  if (bVar1) {
    pRVar2 = (Registry *)operator_new(0x40);
    (pRVar2->func_).body_.super__Function_base._M_manager = (_Manager_type)0x0;
    (pRVar2->func_).body_._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(pRVar2->func_).body_.super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(pRVar2->func_).body_.super__Function_base._M_functor + 8) = 0;
    (pRVar2->name_).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pRVar2->name_).field_2 + 8) = 0;
    *(undefined8 *)&pRVar2->name_ = 0;
    (pRVar2->name_)._M_string_length = 0;
    Registry(pRVar2);
    local_40 = pRVar2;
    std::__cxx11::string::operator=((string *)pRVar2,(string *)name);
    pRVar2 = local_40;
    ppRVar3 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>_>_>
                            *)it.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_true>
                              ._M_cur,name);
    *ppRVar3 = pRVar2;
    name_local = &local_40->name_;
  }
  else {
    if (!override) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/registry.cc"
                 ,0x50);
      poVar4 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1d8);
      poVar5 = std::operator<<((ostream *)poVar4,"Check failed: override");
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::operator<<(poVar5,"Global PackedFunc ");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::operator<<(poVar5," is already registered");
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1d8);
    }
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::Registry_*>,_false,_true>
                           *)&local_30);
    name_local = &ppVar6->second->name_;
  }
  return (Registry *)name_local;
}

Assistant:

Registry &Registry::Register(const std::string &name, bool override) { // NOLINT(*)
  Manager *m = Manager::Global();
  //std::lock_guard<std::mutex> lock(m->mutex);
  auto it = m->fmap.find(name);
  if (it == m->fmap.end()) {
    Registry *r = new Registry();
    r->name_ = name;
    m->fmap[name] = r;
    return *r;
  } else {
    CHECK(override)
        << "Global PackedFunc " << name << " is already registered";
    return *it->second;
  }
}